

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall QFSFileEngine::setSize(QFSFileEngine *this,qint64 size)

{
  QAbstractFileEnginePrivate *pQVar1;
  FILE *__stream;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  iVar2 = *(int *)&pQVar1[3].q_ptr;
  if (iVar2 == -1) {
    __stream = (FILE *)pQVar1[3].errorString.d.ptr;
    if (__stream == (FILE *)0x0) {
      QFileSystemEntry::nativeFilePath((NativePath *)&local_40,(QFileSystemEntry *)(pQVar1 + 1));
      if (local_40.ptr == (char16_t *)0x0) {
        local_40.ptr = L"";
      }
      iVar2 = truncate64((char *)local_40.ptr,size);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_40);
      goto LAB_0012601a;
    }
    iVar2 = fileno(__stream);
  }
  iVar2 = ftruncate64(iVar2,size);
LAB_0012601a:
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    qt_error_string((QString *)&local_40,*piVar3);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,ResizeError,(QString *)&local_40)
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setSize(qint64 size)
{
    Q_D(QFSFileEngine);
    bool ret = false;
    if (d->fd != -1)
        ret = QT_FTRUNCATE(d->fd, size) == 0;
    else if (d->fh)
        ret = QT_FTRUNCATE(QT_FILENO(d->fh), size) == 0;
    else
        ret = QT_TRUNCATE(d->fileEntry.nativeFilePath().constData(), size) == 0;
    if (!ret)
        setError(QFile::ResizeError, qt_error_string(errno));
    return ret;
}